

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::reparseAlternative<12ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata,
                  size_t ignoreIndex)

{
  bool bVar1;
  ReportMetadata *in_RDI;
  long in_R8;
  optional<metaf::MinMaxTemperatureGroup> parsed;
  MinMaxTemperatureGroup *in_stack_ffffffffffffff78;
  ReportMetadata *pRVar2;
  string *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa8;
  ReportMetadata *in_stack_ffffffffffffffb0;
  ReportPart in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  
  pRVar2 = in_RDI;
  if (in_R8 != 0xc) {
    MinMaxTemperatureGroup::parse
              (in_stack_ffffffffffffff90,(ReportPart)((ulong)in_RDI >> 0x20),in_RDI);
    bVar1 = std::optional<metaf::MinMaxTemperatureGroup>::has_value
                      ((optional<metaf::MinMaxTemperatureGroup> *)0x25d938);
    if (bVar1) {
      std::optional<metaf::MinMaxTemperatureGroup>::operator*
                ((optional<metaf::MinMaxTemperatureGroup> *)0x25d948);
      std::
      variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
      ::variant<metaf::MinMaxTemperatureGroup_const&,void,void,metaf::MinMaxTemperatureGroup,void>
                ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                  *)in_RDI,in_stack_ffffffffffffff78);
      return (Group *)pRVar2;
    }
  }
  reparseAlternative<13ul>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  return (Group *)pRVar2;
}

Assistant:

static Group reparseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata,
		size_t ignoreIndex)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			if (I != ignoreIndex) {
				const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
				if (parsed.has_value()) return *parsed;
			}
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return reparseAlternative<I+1>(group, reportPart, reportMetadata, ignoreIndex);
		}
	}